

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_matrix_palette(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_matrix_palette != 0) {
    glad_glCurrentPaletteMatrixARB =
         (PFNGLCURRENTPALETTEMATRIXARBPROC)(*load)("glCurrentPaletteMatrixARB");
    glad_glMatrixIndexubvARB = (PFNGLMATRIXINDEXUBVARBPROC)(*load)("glMatrixIndexubvARB");
    glad_glMatrixIndexusvARB = (PFNGLMATRIXINDEXUSVARBPROC)(*load)("glMatrixIndexusvARB");
    glad_glMatrixIndexuivARB = (PFNGLMATRIXINDEXUIVARBPROC)(*load)("glMatrixIndexuivARB");
    glad_glMatrixIndexPointerARB =
         (PFNGLMATRIXINDEXPOINTERARBPROC)(*load)("glMatrixIndexPointerARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_matrix_palette(GLADloadproc load) {
	if(!GLAD_GL_ARB_matrix_palette) return;
	glad_glCurrentPaletteMatrixARB = (PFNGLCURRENTPALETTEMATRIXARBPROC)load("glCurrentPaletteMatrixARB");
	glad_glMatrixIndexubvARB = (PFNGLMATRIXINDEXUBVARBPROC)load("glMatrixIndexubvARB");
	glad_glMatrixIndexusvARB = (PFNGLMATRIXINDEXUSVARBPROC)load("glMatrixIndexusvARB");
	glad_glMatrixIndexuivARB = (PFNGLMATRIXINDEXUIVARBPROC)load("glMatrixIndexuivARB");
	glad_glMatrixIndexPointerARB = (PFNGLMATRIXINDEXPOINTERARBPROC)load("glMatrixIndexPointerARB");
}